

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qglxintegration.cpp
# Opt level: O2

void __thiscall
QGLXContext::QGLXContext
          (QGLXContext *this,Display *display,QXcbScreen *screen,QSurfaceFormat *format,
          QPlatformOpenGLContext *share)

{
  QSurfaceFormat *this_00;
  undefined4 uVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  char cVar6;
  byte bVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  GLXFBConfig config;
  char *pcVar11;
  code *pcVar12;
  XVisualInfo *visualInfo;
  pointer piVar13;
  undefined8 uVar14;
  long lVar15;
  Window WVar16;
  undefined8 uVar17;
  parameter_type t;
  RenderableType RVar18;
  uint t_00;
  int i;
  ulong uVar19;
  long in_FS_OFFSET;
  QArrayDataPointer<QByteArray> local_b8;
  char *local_a0;
  QArrayDataPointer<int> local_90;
  QArrayDataPointer<int> local_78;
  QArrayDataPointer<int> local_58;
  QSurfaceFormat local_40 [8];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  QPlatformOpenGLContext::QPlatformOpenGLContext((QPlatformOpenGLContext *)this);
  *(undefined ***)this = &PTR__QGLXContext_00111f40;
  *(undefined ***)(this + 0x10) = &PTR__QGLXContext_00111fc0;
  *(Display **)(this + 0x18) = display;
  this_00 = (QSurfaceFormat *)(this + 0x38);
  *(undefined8 *)(this + 0x20) = 0;
  *(undefined8 *)(this + 0x28) = 0;
  *(undefined8 *)(this + 0x30) = 0;
  QSurfaceFormat::QSurfaceFormat(this_00,format);
  *(undefined2 *)(this + 0x40) = 0x100;
  *(undefined8 *)(this + 0x48) = 0;
  this[0x50] = (QGLXContext)0x0;
  iVar8 = QSurfaceFormat::renderableType();
  RVar18 = (RenderableType)this_00;
  if (iVar8 == 0) {
    QOpenGLContext::openGLModuleType();
    QSurfaceFormat::setRenderableType(RVar18);
  }
  iVar8 = QSurfaceFormat::renderableType();
  if ((iVar8 == 1) || (iVar8 = QSurfaceFormat::renderableType(), iVar8 == 2)) {
    if (share != (QPlatformOpenGLContext *)0x0) {
      *(undefined8 *)(this + 0x30) = *(undefined8 *)(share + 0x28);
    }
    uVar14 = *(undefined8 *)(this + 0x18);
    uVar1 = *(undefined4 *)(*(long *)(screen + 0x20) + 0x10);
    QSurfaceFormat::QSurfaceFormat(local_40,this_00);
    config = (GLXFBConfig)qglx_findConfig(uVar14,uVar1,local_40,0,1,0);
    QSurfaceFormat::~QSurfaceFormat(local_40);
    *(GLXFBConfig *)(this + 0x20) = config;
    if (config == (GLXFBConfig)0x0) {
      iVar8 = QSurfaceFormat::renderableType();
      if (iVar8 != 2) {
        visualInfo = (XVisualInfo *)
                     qglx_findVisualInfo(*(_XDisplay **)(this + 0x18),
                                         *(int *)(*(long *)(screen + 0x20) + 0x10),this_00,1,0);
        if (visualInfo == (XVisualInfo *)0x0) {
          local_b8.d._0_4_ = 2;
          local_b8.size._4_4_ = 0;
          local_b8._4_8_ = 0;
          local_b8.ptr._4_4_ = 0;
          local_b8.size._0_4_ = 0;
          local_a0 = "default";
          QMessageLogger::fatal((char *)&local_b8,"Could not initialize GLX");
          goto LAB_00109c55;
        }
        lVar15 = glXCreateContext(*(undefined8 *)(this + 0x18),visualInfo,
                                  *(undefined8 *)(this + 0x30),1);
        *(long *)(this + 0x28) = lVar15;
        if ((lVar15 == 0) && (*(long *)(this + 0x30) != 0)) {
          *(undefined8 *)(this + 0x30) = 0;
          uVar14 = glXCreateContext(*(undefined8 *)(this + 0x18),visualInfo,0,1);
          *(undefined8 *)(this + 0x28) = uVar14;
        }
        WVar16 = createDummyWindow(*(Display **)(this + 0x18),visualInfo,
                                   *(int *)(*(long *)(screen + 0x20) + 0x10),
                                   (ulong)**(uint **)(*(long *)(screen + 0x20) + 8));
        XFree(visualInfo);
        goto LAB_00109b31;
      }
    }
    else {
      local_b8.size._0_4_ = 0xaaaaaaaa;
      local_b8.size._4_4_ = 0xaaaaaaaa;
      local_b8.d._0_4_ = 0xaaaaaaaa;
      local_b8._4_8_ = 0xaaaaaaaaaaaaaaaa;
      local_b8.ptr._4_4_ = 0xaaaaaaaa;
      pcVar11 = (char *)glXQueryExtensionsString
                                  (*(undefined8 *)(this + 0x18),
                                   *(undefined4 *)(*(long *)(screen + 0x20) + 0x10));
      QByteArray::QByteArray((QByteArray *)&local_58,pcVar11,-1);
      QByteArray::split((char)&local_b8);
      QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_58);
      bVar2 = QListSpecialMethodsBase<QByteArray>::contains<char[23]>
                        ((QListSpecialMethodsBase<QByteArray> *)&local_b8,
                         (char (*) [23])"GLX_ARB_create_context");
      if (bVar2) {
        pcVar12 = (code *)glXGetProcAddress("glXCreateContextAttribsARB");
      }
      else {
        pcVar12 = (code *)0x0;
      }
      bVar2 = QListSpecialMethodsBase<QByteArray>::contains<char[31]>
                        ((QListSpecialMethodsBase<QByteArray> *)&local_b8,
                         (char (*) [31])"GLX_ARB_create_context_profile");
      bVar3 = QListSpecialMethodsBase<QByteArray>::contains<char[34]>
                        ((QListSpecialMethodsBase<QByteArray> *)&local_b8,
                         (char (*) [34])"GLX_ARB_create_context_robustness");
      bVar4 = QListSpecialMethodsBase<QByteArray>::contains<char[37]>
                        ((QListSpecialMethodsBase<QByteArray> *)&local_b8,
                         (char (*) [37])"GLX_NV_robustness_video_memory_purge");
      if ((pcVar12 != (code *)0x0) &&
         ((iVar8 = QSurfaceFormat::renderableType(), iVar8 != 2 ||
          ((bVar2 && (bVar5 = QListSpecialMethodsBase<QByteArray>::contains<char[35]>
                                        ((QListSpecialMethodsBase<QByteArray> *)&local_b8,
                                         (char (*) [35])"GLX_EXT_create_context_es2_profile"), bVar5
                     )))))) {
        iVar9 = QSurfaceFormat::majorVersion();
        iVar10 = QSurfaceFormat::minorVersion();
        iVar8 = 9;
        if (iVar10 < 9) {
          iVar8 = iVar10;
        }
        iVar8 = iVar8 + iVar9 * 10;
        local_58.d = (Data *)0x0;
        local_58.ptr = (int *)0x0;
        local_58.size = 0;
        iVar9 = QSurfaceFormat::renderableType();
        if (iVar9 == 1) {
          if (0x2e < iVar8) {
            QList<int>::append((QList<int> *)&local_58,iVar8);
          }
          QList<int>::append((QList<int> *)&local_58,0x2e);
          QList<int>::append((QList<int> *)&local_58,0x2d);
          QList<int>::append((QList<int> *)&local_58,0x2c);
          QList<int>::append((QList<int> *)&local_58,0x2b);
          QList<int>::append((QList<int> *)&local_58,0x2a);
          QList<int>::append((QList<int> *)&local_58,0x29);
          QList<int>::append((QList<int> *)&local_58,0x28);
          QList<int>::append((QList<int> *)&local_58,0x21);
          QList<int>::append((QList<int> *)&local_58,0x20);
          QList<int>::append((QList<int> *)&local_58,0x1f);
          QList<int>::append((QList<int> *)&local_58,0x1e);
          QList<int>::append((QList<int> *)&local_58,0x15);
          QList<int>::append((QList<int> *)&local_58,0x14);
        }
        else {
          iVar9 = QSurfaceFormat::renderableType();
          if (iVar9 == 2) {
            if (0x20 < iVar8) {
              QList<int>::append((QList<int> *)&local_58,iVar8);
            }
            QList<int>::append((QList<int> *)&local_58,0x20);
            QList<int>::append((QList<int> *)&local_58,0x1f);
            QList<int>::append((QList<int> *)&local_58,0x1e);
            QList<int>::append((QList<int> *)&local_58,0x14);
            QSurfaceFormat::setOptions(this_00,0);
          }
        }
        if (share != (QPlatformOpenGLContext *)0x0) {
          (**(code **)(*(long *)share + 0x18))(&local_78);
          cVar6 = QSurfaceFormat::testOption((FormatOption)&local_78);
          QSurfaceFormat::~QSurfaceFormat((QSurfaceFormat *)&local_78);
          if (cVar6 != '\0') {
            QSurfaceFormat::setOption(RVar18,true);
          }
        }
        for (uVar19 = 0; (*(long *)(this + 0x28) == 0 && (uVar19 < (ulong)local_58.size));
            uVar19 = uVar19 + 1) {
          piVar13 = QList<int>::data((QList<int> *)&local_58);
          iVar9 = piVar13[uVar19];
          if (iVar9 <= iVar8) {
            local_78.size = 0;
            local_78.d = (Data *)0x0;
            local_78.ptr = (int *)0x0;
            QList<int>::append((QList<int> *)&local_78,0x2091);
            QList<int>::append((QList<int> *)&local_78,iVar9 / 10);
            QList<int>::append((QList<int> *)&local_78,0x2092);
            QList<int>::append((QList<int> *)&local_78,iVar9 % 10);
            iVar10 = QSurfaceFormat::renderableType();
            if (iVar10 == 1) {
              if (0x1f < iVar9 && bVar2) {
                iVar10 = QSurfaceFormat::profile();
                QList<int>::append((QList<int> *)&local_78,0x9126);
                QList<int>::append((QList<int> *)&local_78,(iVar10 != 1) + 1);
              }
              bVar7 = QSurfaceFormat::testOption(RVar18);
              t_00 = (uint)bVar7 | (uint)bVar3 << 2;
              if ((iVar9 < 0x1e) || (cVar6 = QSurfaceFormat::testOption(RVar18), cVar6 != '\0')) {
                t = 0x2094;
                if (t_00 == 0) goto LAB_0010996a;
              }
              else {
                t_00 = t_00 | 2;
                t = 0x2094;
              }
LAB_00109957:
              QList<int>::append((QList<int> *)&local_78,t);
              QList<int>::append((QList<int> *)&local_78,t_00);
            }
            else {
              iVar9 = QSurfaceFormat::renderableType();
              t = 0x9126;
              t_00 = 4;
              if (iVar9 == 2) goto LAB_00109957;
            }
LAB_0010996a:
            if ((bVar3) && (cVar6 = QSurfaceFormat::testOption(RVar18), cVar6 != '\0')) {
              local_90.d = local_78.d;
              local_90.ptr = local_78.ptr;
              local_90.size = local_78.size;
              if (local_78.d != (Data *)0x0) {
                LOCK();
                ((local_78.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                     ((local_78.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                     1;
                UNLOCK();
              }
              QList<int>::append((QList<int> *)&local_90,0x8256);
              QList<int>::append((QList<int> *)&local_90,0x8252);
              if (bVar4) {
                QList<int>::append((QList<int> *)&local_90,0x20f7);
                QList<int>::append((QList<int> *)&local_90,1);
              }
              QList<int>::append((QList<int> *)&local_90,0);
              uVar14 = *(undefined8 *)(this + 0x18);
              uVar17 = *(undefined8 *)(this + 0x30);
              piVar13 = QList<int>::data((QList<int> *)&local_90);
              uVar14 = (*pcVar12)(uVar14,config,uVar17,1,piVar13);
              *(undefined8 *)(this + 0x28) = uVar14;
              QArrayDataPointer<int>::~QArrayDataPointer(&local_90);
            }
            if (*(long *)(this + 0x28) == 0) {
              QList<int>::append((QList<int> *)&local_78,0);
              uVar14 = *(undefined8 *)(this + 0x18);
              uVar17 = *(undefined8 *)(this + 0x30);
              piVar13 = QList<int>::data((QList<int> *)&local_78);
              lVar15 = (*pcVar12)(uVar14,config,uVar17,1,piVar13);
              *(long *)(this + 0x28) = lVar15;
              if ((lVar15 == 0) && (*(long *)(this + 0x30) != 0)) {
                uVar14 = *(undefined8 *)(this + 0x18);
                piVar13 = QList<int>::data((QList<int> *)&local_78);
                lVar15 = (*pcVar12)(uVar14,config,0,1,piVar13);
                *(long *)(this + 0x28) = lVar15;
                if (lVar15 != 0) {
                  *(undefined8 *)(this + 0x30) = 0;
                }
              }
            }
            else {
              uVar14 = (**(code **)(*(long *)this + 0x60))(this,"glGetGraphicsResetStatusARB");
              *(undefined8 *)(this + 0x48) = uVar14;
            }
            QArrayDataPointer<int>::~QArrayDataPointer(&local_78);
          }
        }
        QArrayDataPointer<int>::~QArrayDataPointer(&local_58);
      }
      if (*(long *)(this + 0x28) != 0) goto LAB_00109aec;
      iVar8 = QSurfaceFormat::renderableType();
      if (iVar8 == 2) {
        bVar2 = false;
        WVar16 = 0;
      }
      else {
        lVar15 = glXCreateNewContext(*(undefined8 *)(this + 0x18),config,0x8014,
                                     *(undefined8 *)(this + 0x30),1);
        *(long *)(this + 0x28) = lVar15;
        if ((lVar15 == 0) && (*(long *)(this + 0x30) != 0)) {
          lVar15 = glXCreateNewContext(*(undefined8 *)(this + 0x18),config,0x8014,0,1);
          *(long *)(this + 0x28) = lVar15;
          if (lVar15 != 0) {
            *(undefined8 *)(this + 0x30) = 0;
LAB_00109aec:
            qglx_surfaceFormatFromGLXFBConfig(this_00,*(_XDisplay **)(this + 0x18),config,0);
          }
        }
        else if (lVar15 != 0) goto LAB_00109aec;
        WVar16 = createDummyWindow(*(Display **)(this + 0x18),config,
                                   *(int *)(*(long *)(screen + 0x20) + 0x10),
                                   (ulong)**(uint **)(*(long *)(screen + 0x20) + 8));
        bVar2 = true;
      }
      QArrayDataPointer<QByteArray>::~QArrayDataPointer(&local_b8);
      if (bVar2) {
LAB_00109b31:
        if ((WVar16 != 0) && (*(long *)(this + 0x28) != 0)) {
          uVar14 = glXGetCurrentContext();
          uVar17 = glXGetCurrentDrawable();
          glXMakeCurrent(*(undefined8 *)(this + 0x18),WVar16,*(undefined8 *)(this + 0x28));
          updateFormatFromContext(this_00);
          glXMakeCurrent(*(undefined8 *)(this + 0x18),uVar17,uVar14);
        }
        XDestroyWindow(*(undefined8 *)(this + 0x18),WVar16);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
LAB_00109c55:
  __stack_chk_fail();
}

Assistant:

QGLXContext::QGLXContext(Display *display, QXcbScreen *screen, const QSurfaceFormat &format, QPlatformOpenGLContext *share)
    : QPlatformOpenGLContext()
    , m_display(display)
    , m_format(format)
    , m_ownsContext(true)
{
    if (m_format.renderableType() == QSurfaceFormat::DefaultRenderableType)
        m_format.setRenderableType(QOpenGLContext::openGLModuleType() == QOpenGLContext::LibGL
                                   ? QSurfaceFormat::OpenGL : QSurfaceFormat::OpenGLES);
    if (m_format.renderableType() != QSurfaceFormat::OpenGL && m_format.renderableType() != QSurfaceFormat::OpenGLES)
        return;

    if (share)
        m_shareContext = static_cast<const QGLXContext*>(share)->glxContext();

    GLXFBConfig config = qglx_findConfig(m_display, screen->screenNumber(), m_format);
    m_config = config;
    XVisualInfo *visualInfo = nullptr;
    Window window = 0; // Temporary window used to query OpenGL context

    if (config) {
        const QByteArrayList glxExt = QByteArray(glXQueryExtensionsString(m_display, screen->screenNumber())).split(' ');

        // Resolve entry point for glXCreateContextAttribsARB
        glXCreateContextAttribsARBProc glXCreateContextAttribsARB = nullptr;
        if (glxExt.contains("GLX_ARB_create_context"))
            glXCreateContextAttribsARB = (glXCreateContextAttribsARBProc) glXGetProcAddress((const GLubyte*)"glXCreateContextAttribsARB");

        const bool supportsProfiles = glxExt.contains("GLX_ARB_create_context_profile");
        const bool supportsRobustness = glxExt.contains("GLX_ARB_create_context_robustness");
        const bool supportsVideoMemoryPurge = glxExt.contains("GLX_NV_robustness_video_memory_purge");

        // Use glXCreateContextAttribsARB if available
        // Also, GL ES context creation requires GLX_EXT_create_context_es2_profile
        if (glXCreateContextAttribsARB != nullptr
                && (m_format.renderableType() != QSurfaceFormat::OpenGLES || (supportsProfiles && glxExt.contains("GLX_EXT_create_context_es2_profile")))) {
            // Try to create an OpenGL context for each known OpenGL version in descending
            // order from the requested version.
            const int requestedVersion = m_format.majorVersion() * 10 + qMin(m_format.minorVersion(), 9);

            QList<int> glVersions;
            if (m_format.renderableType() == QSurfaceFormat::OpenGL) {
                if (requestedVersion > 46)
                    glVersions << requestedVersion;

                // Don't bother with versions below 2.0
                glVersions << 46 << 45 << 44 << 43 << 42 << 41 << 40 << 33 << 32 << 31 << 30 << 21 << 20;
            } else if (m_format.renderableType() == QSurfaceFormat::OpenGLES) {
                if (requestedVersion > 32)
                    glVersions << requestedVersion;

                // Don't bother with versions below ES 2.0
                glVersions << 32 << 31 << 30 << 20;
                // ES does not support any format option
                m_format.setOptions(QSurfaceFormat::FormatOptions());
            }
            // Robustness must match that of the shared context.
            if (share && share->format().testOption(QSurfaceFormat::ResetNotification))
                m_format.setOption(QSurfaceFormat::ResetNotification);
            Q_ASSERT(glVersions.size() > 0);

            for (int i = 0; !m_context && i < glVersions.size(); i++) {
                const int version = glVersions[i];
                if (version > requestedVersion)
                    continue;

                const int majorVersion = version / 10;
                const int minorVersion = version % 10;

                QList<int> contextAttributes;
                contextAttributes << GLX_CONTEXT_MAJOR_VERSION_ARB << majorVersion
                                  << GLX_CONTEXT_MINOR_VERSION_ARB << minorVersion;


                if (m_format.renderableType() == QSurfaceFormat::OpenGL) {
                    // If asking for OpenGL 3.2 or newer we should also specify a profile
                    if (version >= 32 && supportsProfiles) {
                        if (m_format.profile() == QSurfaceFormat::CoreProfile)
                            contextAttributes << GLX_CONTEXT_PROFILE_MASK_ARB << GLX_CONTEXT_CORE_PROFILE_BIT_ARB;
                        else
                            contextAttributes << GLX_CONTEXT_PROFILE_MASK_ARB << GLX_CONTEXT_COMPATIBILITY_PROFILE_BIT_ARB;
                    }

                    int flags = 0;

                    if (supportsRobustness)
                        flags |= GLX_CONTEXT_ROBUST_ACCESS_BIT_ARB;

                    if (m_format.testOption(QSurfaceFormat::DebugContext))
                        flags |= GLX_CONTEXT_DEBUG_BIT_ARB;

                    // A forward-compatible context may be requested for 3.0 and later
                    if (version >= 30 && !m_format.testOption(QSurfaceFormat::DeprecatedFunctions))
                        flags |= GLX_CONTEXT_FORWARD_COMPATIBLE_BIT_ARB;

                    if (flags != 0)
                        contextAttributes << GLX_CONTEXT_FLAGS_ARB << flags;
                } else if (m_format.renderableType() == QSurfaceFormat::OpenGLES) {
                    contextAttributes << GLX_CONTEXT_PROFILE_MASK_ARB << GLX_CONTEXT_ES2_PROFILE_BIT_EXT;
                }

                if (supportsRobustness && m_format.testOption(QSurfaceFormat::ResetNotification)) {
                    QList<int> contextAttributesWithRobustness = contextAttributes;
                    contextAttributesWithRobustness << GLX_CONTEXT_RESET_NOTIFICATION_STRATEGY_ARB << GLX_LOSE_CONTEXT_ON_RESET_ARB;
                    if (supportsVideoMemoryPurge)
                        contextAttributesWithRobustness << GLX_GENERATE_RESET_ON_VIDEO_MEMORY_PURGE_NV << GL_TRUE;

                    contextAttributesWithRobustness << None;
                    m_context = glXCreateContextAttribsARB(m_display, config, m_shareContext, true,
                                                           contextAttributesWithRobustness.data());
                    // Context creation against a shared context may fail specifically due to this request, so try
                    // without before dropping sharing.
                }

                if (m_context) {
                    m_getGraphicsResetStatus = reinterpret_cast<GLenum (QOPENGLF_APIENTRYP)()>(getProcAddress("glGetGraphicsResetStatusARB"));
                } else {
                    contextAttributes << None;
                    m_context = glXCreateContextAttribsARB(m_display, config, m_shareContext, true, contextAttributes.data());
                    if (!m_context && m_shareContext) {
                        // re-try without a shared glx context
                        m_context = glXCreateContextAttribsARB(m_display, config, nullptr, true, contextAttributes.data());
                        if (m_context)
                            m_shareContext = nullptr;
                    }
                }
            }
        }

        // Could not create a context using glXCreateContextAttribsARB, falling back to glXCreateNewContext.
        if (!m_context) {
            // requesting an OpenGL ES context requires glXCreateContextAttribsARB, so bail out
            if (m_format.renderableType() == QSurfaceFormat::OpenGLES)
                return;

            m_context = glXCreateNewContext(m_display, config, GLX_RGBA_TYPE, m_shareContext, true);
            if (!m_context && m_shareContext) {
                // re-try without a shared glx context
                m_context = glXCreateNewContext(m_display, config, GLX_RGBA_TYPE, nullptr, true);
                if (m_context)
                    m_shareContext = nullptr;
            }
        }

        // Get the basic surface format details
        if (m_context)
            qglx_surfaceFormatFromGLXFBConfig(&m_format, m_display, config);

        // Create a temporary window so that we can make the new context current
        window = createDummyWindow(m_display, config, screen->screenNumber(), screen->root());
    } else {
        // requesting an OpenGL ES context requires glXCreateContextAttribsARB, so bail out
        if (m_format.renderableType() == QSurfaceFormat::OpenGLES)
            return;

        // Note that m_format gets updated with the used surface format
        visualInfo = qglx_findVisualInfo(m_display, screen->screenNumber(), &m_format);
        if (Q_UNLIKELY(!visualInfo))
            qFatal("Could not initialize GLX");
        m_context = glXCreateContext(m_display, visualInfo, m_shareContext, true);
        if (!m_context && m_shareContext) {
            // re-try without a shared glx context
            m_shareContext = nullptr;
            m_context = glXCreateContext(m_display, visualInfo, nullptr, true);
        }

        // Create a temporary window so that we can make the new context current
        window = createDummyWindow(m_display, visualInfo, screen->screenNumber(), screen->root());
        XFree(visualInfo);
    }

    // Query the OpenGL version and profile
    if (m_context && window) {
        GLXContext prevContext = glXGetCurrentContext();
        GLXDrawable prevDrawable = glXGetCurrentDrawable();
        glXMakeCurrent(m_display, window, m_context);
        updateFormatFromContext(m_format);

        // Make our context non-current
        glXMakeCurrent(m_display, prevDrawable, prevContext);
    }

    // Destroy our temporary window
    XDestroyWindow(m_display, window);
}